

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O3

void __thiscall
helics::apps::SineGenerator::set(SineGenerator *this,string_view parameter,double val)

{
  int iVar1;
  long *__s1;
  size_t __n;
  char *__s2;
  size_type __rlen;
  
  __s1 = (long *)parameter._M_str;
  __n = parameter._M_len;
  switch(__n) {
  case 1:
    iVar1 = bcmp(__s1,"f",__n);
    if (iVar1 == 0) {
LAB_0020cbdb:
      this->frequency = val;
      return;
    }
    __s2 = "a";
    goto LAB_0020cb18;
  case 3:
    iVar1 = bcmp(__s1,"amp",__n);
    goto joined_r0x0020cb58;
  case 4:
    iVar1 = bcmp(__s1,"freq",__n);
    if (iVar1 == 0) goto LAB_0020cbdb;
    iVar1 = bcmp(__s1,"dfdt",__n);
    if (iVar1 == 0) {
      this->dfdt = val;
      return;
    }
    if ((int)*__s1 == 0x74646164) {
      this->dAdt = val;
      return;
    }
    break;
  case 5:
    iVar1 = bcmp(__s1,"level",__n);
    if (iVar1 == 0) {
      this->level = val;
      return;
    }
    break;
  case 6:
    iVar1 = bcmp(__s1,"period",__n);
    if (iVar1 == 0) {
      val = 1.0 / val;
      goto LAB_0020cbdb;
    }
    iVar1 = bcmp(__s1,"offset",__n);
    if (iVar1 == 0) {
      this->offset = val;
      return;
    }
    break;
  case 9:
    if ((char)__s1[1] == 'y' && *__s1 == 0x636e657571657266) goto LAB_0020cbdb;
    __s2 = "amplitude";
LAB_0020cb18:
    iVar1 = bcmp(__s1,__s2,__n);
joined_r0x0020cb58:
    if (iVar1 == 0) {
      this->amplitude = val;
      return;
    }
  }
  SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
  return;
}

Assistant:

void SineGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "level") {
            level = val;
        } else if (parameter == "offset") {
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }